

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nagel.c
# Opt level: O2

float dyy(qnode_ptr_t q,int x,int y,int z)

{
  param512_t *papVar1;
  int iVar2;
  long lVar3;
  int *piVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  float fVar8;
  
  iVar2 = C.m / 2;
  iVar7 = iVar2 * 2 + q->ofst;
  lVar5 = (long)(q->res * x + y);
  papVar1 = q->param_ptr[z];
  piVar4 = &(*papVar1)[lVar5].err;
  if ((((iVar7 <= y) && (iVar7 <= x)) && (x < q->sizy - iVar7)) && (y < q->sizx - iVar7)) {
    *piVar4 = 0;
    fVar8 = 0.0;
    lVar6 = 0;
    for (lVar3 = (long)-iVar2; lVar3 <= iVar2; lVar3 = lVar3 + 1) {
      fVar8 = fVar8 + *(float *)((long)papVar1 +
                                lVar6 * 8 + lVar5 * 0x20 + (long)iVar2 * -0x20 + 0x14) *
                      *(float *)((long)C.k + lVar6);
      lVar6 = lVar6 + 4;
    }
    return fVar8 / C.f;
  }
  *piVar4 = 1;
  return 0.0;
}

Assistant:

float dyy(q,x,y,z)
qnode_ptr_t q ;
int x, y, z ;

{ extern kernel_t C ;
  float d ;
  int i, h ;

  h = C.m/2 ;
  d = 0.0 ;

  if (overflow(x,y,q->sizy,q->sizx,q->ofst,h,2)) {
    (*q->param_ptr[z])[q->res*x + y].err = SA_OVERFLOW ;
  }
  else {
    (*q->param_ptr[z])[q->res*x + y].err = NO_ERROR ;
    for (i = -h ; i <= h ; i++) {
      d += (*q->param_ptr[z])[q->res*x + y+i].fy*C.k[i+h] ;
    }
    d /= C.f ;
  }
  return(d) ;
}